

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O3

void __thiscall
cmServerProtocol1::HandleCMakeFileChanges(cmServerProtocol1 *this,string *path,int event,int status)

{
  cmServer *pcVar1;
  Value *pVVar2;
  Value obj;
  Value properties;
  Value local_e0;
  Value local_b8;
  Value local_90;
  Value local_68;
  Value local_40;
  
  if (status == 0) {
    if (this->m_isDirty == false) {
      this->m_isDirty = true;
      Json::Value::Value(&local_e0,objectValue);
      pcVar1 = (this->super_cmServerProtocol).m_Server;
      if (pcVar1 != (cmServer *)0x0) {
        cmServer::WriteSignal(pcVar1,&kDIRTY_SIGNAL_abi_cxx11_,&local_e0);
      }
      Json::Value::~Value(&local_e0);
    }
    Json::Value::Value(&local_e0,objectValue);
    Json::Value::Value(&local_40,path);
    pVVar2 = Json::Value::operator[](&local_e0,&kPATH_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar2,&local_40);
    Json::Value::~Value(&local_40);
    Json::Value::Value(&local_90,arrayValue);
    if ((event & 1U) != 0) {
      Json::Value::Value(&local_b8,&kRENAME_PROPERTY_VALUE_abi_cxx11_);
      Json::Value::append(&local_90,&local_b8);
      Json::Value::~Value(&local_b8);
    }
    if ((event & 2U) != 0) {
      Json::Value::Value(&local_b8,&kCHANGE_PROPERTY_VALUE_abi_cxx11_);
      Json::Value::append(&local_90,&local_b8);
      Json::Value::~Value(&local_b8);
    }
    Json::Value::Value(&local_68,&local_90);
    pVVar2 = Json::Value::operator[](&local_e0,&kPROPERTIES_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar2,&local_68);
    Json::Value::~Value(&local_68);
    pcVar1 = (this->super_cmServerProtocol).m_Server;
    if (pcVar1 != (cmServer *)0x0) {
      cmServer::WriteSignal(pcVar1,&kFILE_CHANGE_SIGNAL_abi_cxx11_,&local_e0);
    }
    Json::Value::~Value(&local_90);
    Json::Value::~Value(&local_e0);
    return;
  }
  __assert_fail("status == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmServerProtocol.cxx"
                ,0x1ae,
                "void cmServerProtocol1::HandleCMakeFileChanges(const std::string &, int, int)");
}

Assistant:

void cmServerProtocol1::HandleCMakeFileChanges(const std::string& path,
                                               int event, int status)
{
  assert(status == 0);
  static_cast<void>(status);

  if (!m_isDirty) {
    m_isDirty = true;
    SendSignal(kDIRTY_SIGNAL, Json::objectValue);
  }
  Json::Value obj = Json::objectValue;
  obj[kPATH_KEY] = path;
  Json::Value properties = Json::arrayValue;
  if (event & UV_RENAME) {
    properties.append(kRENAME_PROPERTY_VALUE);
  }
  if (event & UV_CHANGE) {
    properties.append(kCHANGE_PROPERTY_VALUE);
  }

  obj[kPROPERTIES_KEY] = properties;
  SendSignal(kFILE_CHANGE_SIGNAL, obj);
}